

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O3

Type * __thiscall
spvtools::opt::analysis::ConstantManager::GetType(ConstantManager *this,Instruction *inst)

{
  IRContext *this_00;
  TypeManager *this_01;
  uint32_t id;
  Type *pTVar1;
  
  this_00 = this->ctx_;
  if ((this_00->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
    IRContext::BuildTypeManager(this_00);
  }
  this_01 = (this_00->type_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl;
  id = 0;
  if (inst->has_type_id_ == true) {
    id = Instruction::GetSingleWordOperand(inst,0);
  }
  pTVar1 = TypeManager::GetType(this_01,id);
  return pTVar1;
}

Assistant:

Type* ConstantManager::GetType(const Instruction* inst) const {
  return context()->get_type_mgr()->GetType(inst->type_id());
}